

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall diy::Link::~Link(Link *this)

{
  void *in_RDI;
  
  ~Link((Link *)0x12d118);
  operator_delete(in_RDI,0x20);
  return;
}

Assistant:

int       size() const                        { return static_cast<int>(neighbors_.size()); }